

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingScheme.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EncodingScheme::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EncodingScheme *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EncodingScheme *local_18;
  EncodingScheme *this_local;
  
  local_18 = this;
  this_local = (EncodingScheme *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Encoding Scheme:");
  poVar1 = std::operator<<(poVar1,"\n\tClass:    ");
  ENUMS::GetEnumAsStringEncodingClass_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((this->m_EncodingSchemeUnion).m_ui16EncodingScheme >> 0xe),
             Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tType:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_EncodingSchemeUnion).m_ui16EncodingScheme & 0x3fff);
  poVar1 = std::operator<<(poVar1,"\n\tTDL:      ");
  ENUMS::GetEnumAsStringTDLType_abi_cxx11_(&local_1f0,(ENUMS *)(ulong)this->m_ui16TDLType,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EncodingScheme::GetAsString() const
{
    KStringStream ss;

    ss << "Encoding Scheme:"
       << "\n\tClass:    " << GetEnumAsStringEncodingClass( m_EncodingSchemeUnion.m_ui16Class )
       << "\n\tType:     " << m_EncodingSchemeUnion.m_ui16Type
       << "\n\tTDL:      " << GetEnumAsStringTDLType( m_ui16TDLType )
       << "\n";

    return ss.str();
}